

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O1

MPP_RET mpi_encode(MppCtx ctx,MppFrame frame,MppPacket *packet)

{
  MPP_RET MVar1;
  
  if (((byte)mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","enter ctx %p frame %p packet %p\n","mpi_encode",ctx,frame,packet);
  }
  MVar1 = _check_mpp_ctx((MpiImpl *)ctx,"mpi_encode");
  if ((MVar1 == MPP_OK) && (MVar1 = MPP_OK, frame == (MppFrame)0x0 || packet == (MppPacket *)0x0)) {
    _mpp_log_l(2,"mpi","found NULL input frame %p packet %p\n","mpi_encode",frame,packet);
    MVar1 = MPP_ERR_NULL_PTR;
  }
  if (((byte)mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","leave ctx %p ret %d\n","mpi_encode",ctx,(ulong)(uint)MVar1);
  }
  return MVar1;
}

Assistant:

static MPP_RET mpi_encode(MppCtx ctx, MppFrame frame, MppPacket *packet)
{
    MPP_RET ret = MPP_NOK;
    MpiImpl *p = (MpiImpl *)ctx;

    mpi_dbg_func("enter ctx %p frame %p packet %p\n", ctx, frame, packet);
    do {
        ret = check_mpp_ctx(p);
        if (ret)
            break;

        if (NULL == frame || NULL == packet) {
            mpp_err_f("found NULL input frame %p packet %p\n", frame, packet);
            ret = MPP_ERR_NULL_PTR;
            break;
        }

        // TODO: do encode here
    } while (0);

    mpi_dbg_func("leave ctx %p ret %d\n", ctx, ret);
    return ret;
}